

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::InvalidEnumTest::Run(InvalidEnumTest *this)

{
  GLuint program_00;
  char *src_vs;
  char *src_fs;
  GLenum local_ec;
  GLchar local_e8 [4];
  GLenum props [1];
  GLchar name [100];
  GLsizei local_78;
  GLint local_74;
  GLsizei len;
  GLint res;
  long error;
  string local_58 [32];
  string local_38 [36];
  GLuint local_14;
  InvalidEnumTest *pIStack_10;
  GLuint program;
  InvalidEnumTest *this_local;
  
  pIStack_10 = this;
  (*(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x16])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x17])(local_58);
  src_fs = (char *)std::__cxx11::string::c_str();
  program_00 = PIQBase::CreateProgram((PIQBase *)this,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  local_14 = program_00;
  glu::CallLogWrapper::glBindAttribLocation
            (&(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,program_00,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation
            (&(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,local_14,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,local_14);
  _len = 0;
  memset(local_e8,0,100);
  local_ec = 0xde0;
  anon_unknown_0::Output
            (
            "Case 1: <programInterface> is ATOMIC_COUNTER_BUFFER in GetProgramResourceIndex or GetProgramResourceName\n"
            );
  glu::CallLogWrapper::glGetProgramResourceIndex
            (&(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,local_14,0x92c0,local_e8);
  (*(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xc])(this,0x500,&len);
  glu::CallLogWrapper::glGetProgramResourceName
            (&(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,local_14,0x92c0,0,0x400,&local_78,local_e8);
  (*(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xc])(this,0x500,&len);
  anon_unknown_0::Output("Case 1 finished\n");
  anon_unknown_0::Output
            (
            "Case 2: <props> is not a property name supported by the command GetProgramResourceiv\n"
            );
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,local_14,0x92e3,0,1,&local_ec,0x400,&local_78,
             &local_74);
  (*(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xc])(this,0x500,&len);
  anon_unknown_0::Output("Case 2 finished\n");
  glu::CallLogWrapper::glGetProgramResourceLocation
            (&(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,local_14,0x92c0,"position");
  (*(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xc])(this,0x500,&len);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_AtomicCounterSimple).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,local_14);
  return _len;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		GLint   res;
		GLsizei len;
		GLchar  name[100] = { '\0' };
		GLenum  props[1]  = { GL_TEXTURE_1D };

		Output("Case 1: <programInterface> is ATOMIC_COUNTER_BUFFER in GetProgramResourceIndex or "
			   "GetProgramResourceName\n");
		glGetProgramResourceIndex(program, GL_ATOMIC_COUNTER_BUFFER, name);
		ExpectError(GL_INVALID_ENUM, error);
		glGetProgramResourceName(program, GL_ATOMIC_COUNTER_BUFFER, 0, 1024, &len, name);
		ExpectError(GL_INVALID_ENUM, error);
		Output("Case 1 finished\n");

		Output("Case 2: <props> is not a property name supported by the command GetProgramResourceiv\n");
		glGetProgramResourceiv(program, GL_PROGRAM_INPUT, 0, 1, props, 1024, &len, &res);
		ExpectError(GL_INVALID_ENUM, error);
		Output("Case 2 finished\n");

		glGetProgramResourceLocation(program, GL_ATOMIC_COUNTER_BUFFER, "position");
		ExpectError(GL_INVALID_ENUM, error);

		glDeleteProgram(program);
		return error;
	}